

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

void __thiscall pstore::database::~database(database *this)

{
  storage *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  factory *pfVar4;
  system_page_size_interface *psVar5;
  _Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  __ptr_00;
  pointer *__ptr;
  long lVar6;
  
  this->_vptr_database = (_func_int **)&PTR__database_0015d480;
  if (this->closed_ == false) {
    if ((this->modified_ == true) && (this->vacuum_mode_ != disabled)) {
      start_vacuum(this);
    }
    this->closed_ = true;
  }
  pcVar2 = (this->sync_name_)._M_dataplus._M_p;
  paVar1 = &(this->sync_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  lVar6 = 0;
  do {
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(this->indices_)._M_elems[5].
                      super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + lVar6);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != -0x60);
  std::unique_lock<pstore::file::range_lock>::~unique_lock(&this->lock_);
  pstore::file::range_lock::~range_lock(&this->range_lock_);
  p_Var3 = (this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  ::~vector(&(this->storage_).regions_);
  pfVar4 = (this->storage_).region_factory_._M_t.
           super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
           .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl;
  if (pfVar4 != (factory *)0x0) {
    (*pfVar4->_vptr_factory[1])();
  }
  (this->storage_).region_factory_._M_t.
  super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>._M_t
  .super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl = (factory *)0x0;
  psVar5 = (this->storage_).page_size_._M_t.
           super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
           .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl;
  if (psVar5 != (system_page_size_interface *)0x0) {
    (*psVar5->_vptr_system_page_size_interface[1])();
  }
  this_00 = &this->storage_;
  (this->storage_).page_size_._M_t.
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (system_page_size_interface *)0x0;
  p_Var3 = (this->storage_).file_.
           super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  __ptr_00.super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       (this_00->sat_)._M_t.
       super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>;
  if (__ptr_00.super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl
      != (array<pstore::sat_entry,_65536UL> *)0x0) {
    std::default_delete<std::array<pstore::sat_entry,_65536UL>_>::operator()
              ((default_delete<std::array<pstore::sat_entry,_65536UL>_> *)this_00,
               (array<pstore::sat_entry,_65536UL> *)
               __ptr_00.super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
               _M_head_impl);
  }
  (this_00->sat_)._M_t.
  super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> =
       (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0;
  return;
}

Assistant:

database::~database () noexcept {
        no_ex_escape ([this] () { this->close (); });
    }